

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_sub_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  void *__src;
  void *__s;
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  sexp psVar4;
  sexp_sint_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  sexp_conflict local_48;
  sexp_gc_var_t local_40;
  
  __src = (void *)((long)&a->value + 0x10);
  uVar6 = (a->value).string.offset;
  do {
    uVar2 = uVar6;
    if (uVar2 == 1) break;
    uVar6 = uVar2 - 1;
  } while (*(long *)((long)&a->value + uVar2 * 8 + 8) == 0);
  uVar6 = (b->value).string.offset;
  do {
    uVar3 = uVar6;
    if (uVar3 == 1) break;
    uVar6 = uVar3 - 1;
  } while (*(long *)((long)&b->value + uVar3 * 8 + 8) == 0);
  local_48 = (sexp_conflict)0x43e;
  if (uVar2 < uVar3) {
LAB_00119970:
    psVar4 = sexp_bignum_sub_digits(ctx,dst,b,a);
    return psVar4;
  }
  if (uVar2 == uVar3) {
    sVar5 = sexp_bignum_compare_abs(a,b);
    if (sVar5 < 0) goto LAB_00119970;
  }
  local_40.var = &local_48;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  if (dst != (sexp)0x0) {
    uVar6 = (dst->value).string.offset;
    do {
      uVar7 = uVar6;
      if (uVar7 == 1) break;
      uVar6 = uVar7 - 1;
    } while (*(long *)((long)&dst->value + uVar7 * 8 + 8) == 0);
    if (uVar2 <= uVar7) goto LAB_00119a67;
  }
  uVar6 = (a->value).string.offset;
  dst = sexp_alloc_tagged_aux(ctx,uVar6 * 8 + 0x18,0xc);
  (dst->value).string.offset = uVar6;
  uVar7 = (a->value).string.offset;
  uVar8 = uVar6;
  if (uVar7 < uVar6) {
    uVar8 = uVar7;
  }
  (dst->value).flonum_bits[0] = (a->value).flonum_bits[0];
  __s = (void *)((long)&dst->value + 0x10);
  memset(__s,0,uVar6 * 8);
  memmove(__s,__src,uVar8 << 3);
LAB_00119a67:
  if (uVar3 != 0) {
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar8 = uVar6;
      uVar6 = *(ulong *)((long)__src + uVar8 * 8);
      uVar7 = *(ulong *)((long)&b->value + uVar8 * 8 + 0x10);
      if ((uVar7 < uVar6) || ((lVar9 == 0 && (uVar6 == uVar7)))) {
        *(ulong *)((long)&dst->value + uVar8 * 8 + 0x10) = uVar6 - (lVar9 + uVar7);
        bVar10 = false;
        lVar9 = 0;
      }
      else {
        *(ulong *)((long)&dst->value + uVar8 * 8 + 0x10) = -(uVar7 + lVar9);
        *(ulong *)((long)&dst->value + uVar8 * 8 + 0x10) =
             *(long *)((long)__src + uVar8 * 8) - (uVar7 + lVar9);
        lVar9 = 1;
        bVar10 = true;
      }
      uVar6 = uVar8 + 1;
    } while (uVar6 < uVar3);
    if (bVar10 && uVar6 < uVar2) {
      uVar6 = uVar8 + 2;
      do {
        plVar1 = (long *)((long)&dst->value + uVar6 * 8 + 8);
        lVar9 = *plVar1;
        *plVar1 = *plVar1 + -1;
        if (lVar9 != 0) break;
        bVar10 = uVar6 < uVar2;
        uVar6 = uVar6 + 1;
      } while (bVar10);
    }
  }
  (ctx->value).context.saves = local_40.next;
  return dst;
}

Assistant:

sexp sexp_bignum_sub_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    borrow=0, i, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if ((alen < blen) || ((alen == blen) && (sexp_bignum_compare_abs(a, b) < 0)))
    return sexp_bignum_sub_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    if (adata[i] > bdata[i] || (adata[i] == bdata[i] && !borrow)) {
      cdata[i] = adata[i] - bdata[i] - borrow;
      borrow = 0;
    } else {
      cdata[i] = (SEXP_UINT_T_MAX - bdata[i]);
      cdata[i] += 1;
      cdata[i] -= borrow;
      cdata[i] += adata[i];
      borrow = 1;
    }
  }
  for ( ; borrow && (i<alen); i++) {
    borrow = (cdata[i] == 0 ? 1 : 0);
    cdata[i]--;
  }
  sexp_gc_release1(ctx);
  return c;
}